

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O2

DataBlob * __thiscall hrgls::datablob::DataBlob::operator=(DataBlob *this,DataBlob *copy)

{
  hrgls_Status hVar1;
  DataBlob_private *pDVar2;
  hrgls_DataBlob phVar3;
  DataBlob_private *pDVar4;
  
  pDVar4 = this->m_private;
  if (pDVar4 != (DataBlob_private *)0x0) {
    if (pDVar4->blob != (hrgls_DataBlob)0x0) {
      hrgls_DataBlobDestroy(pDVar4->blob);
      pDVar4 = this->m_private;
    }
    operator_delete(pDVar4);
  }
  pDVar2 = (DataBlob_private *)operator_new(0x10);
  pDVar2->blob = (hrgls_DataBlob)0x0;
  *(undefined8 *)&pDVar2->status = 0;
  this->m_private = pDVar2;
  pDVar4 = copy->m_private;
  phVar3 = (hrgls_DataBlob)0x0;
  if (pDVar4 != (DataBlob_private *)0x0) {
    phVar3 = pDVar4->blob;
    hVar1 = 0;
    if (phVar3 == (hrgls_DataBlob)0x0) {
      hVar1 = 0x3ee;
    }
    pDVar4->status = hVar1;
  }
  hVar1 = hrgls_DataBlobCopy(pDVar2,phVar3);
  this->m_private->status = hVar1;
  return this;
}

Assistant:

DataBlob& DataBlob::operator = (const DataBlob&copy)
    {
      // Get rid of any pre-existing data that we have.
      if (m_private) {
        if (m_private->blob) {
          hrgls_DataBlobDestroy(m_private->blob);
        }
        delete m_private;
      }

      m_private = new DataBlob_private();
      m_private->status = hrgls_DataBlobCopy(&m_private->blob, copy.RawDataBlob());
      return *this;
    }